

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::GetReservoirQuantileDecimalFunction
               (AggregateFunctionSet *set,vector<duckdb::LogicalType,_true> *arguments,
               LogicalType *return_value)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunction fun;
  undefined1 local_3a0 [264];
  code *local_298;
  code *local_290;
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)local_3a0,arguments,return_value,(aggregate_size_t)0x0,
             (aggregate_initialize_t)0x0,(aggregate_update_t)0x0,(aggregate_combine_t)0x0,
             (aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,BindReservoirQuantileDecimal,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  local_298 = ReservoirQuantileBindData::Serialize;
  local_290 = ReservoirQuantileBindData::Deserialize;
  AggregateFunction::AggregateFunction(&local_140,(AggregateFunction *)local_3a0);
  this = &(set->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_3a0 + 0x48),
             &LogicalType::INTEGER);
  AggregateFunction::AggregateFunction(&local_270,(AggregateFunction *)local_3a0);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  AggregateFunction::~AggregateFunction((AggregateFunction *)local_3a0);
  return;
}

Assistant:

static void GetReservoirQuantileDecimalFunction(AggregateFunctionSet &set, const vector<LogicalType> &arguments,
                                                const LogicalType &return_value) {
	AggregateFunction fun(arguments, return_value, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                      BindReservoirQuantileDecimal);
	fun.serialize = ReservoirQuantileBindData::Serialize;
	fun.deserialize = ReservoirQuantileBindData::Deserialize;
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);
}